

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_merge_ppt(opj_tcp_t *p_tcp,opj_event_mgr_t *p_manager)

{
  OPJ_BYTE *pOVar1;
  uint local_28;
  uint local_24;
  OPJ_UINT32 l_ppt_data_size;
  OPJ_UINT32 i;
  opj_event_mgr_t *p_manager_local;
  opj_tcp_t *p_tcp_local;
  
  if (p_tcp == (opj_tcp_t *)0x0) {
    __assert_fail("p_tcp != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x1000,"OPJ_BOOL opj_j2k_merge_ppt(opj_tcp_t *, opj_event_mgr_t *)");
  }
  if (p_manager != (opj_event_mgr_t *)0x0) {
    if (p_tcp->ppt_buffer == (OPJ_BYTE *)0x0) {
      if (((byte)p_tcp->field_0x1638 >> 1 & 1) == 0) {
        p_tcp_local._4_4_ = 1;
      }
      else {
        local_28 = 0;
        for (local_24 = 0; local_24 < p_tcp->ppt_markers_count; local_24 = local_24 + 1) {
          local_28 = p_tcp->ppt_markers[local_24].m_data_size + local_28;
        }
        pOVar1 = (OPJ_BYTE *)opj_malloc((ulong)local_28);
        p_tcp->ppt_buffer = pOVar1;
        if (p_tcp->ppt_buffer == (OPJ_BYTE *)0x0) {
          opj_event_msg(p_manager,1,"Not enough memory to read PPT marker\n");
          p_tcp_local._4_4_ = 0;
        }
        else {
          p_tcp->ppt_len = local_28;
          local_28 = 0;
          for (local_24 = 0; local_24 < p_tcp->ppt_markers_count; local_24 = local_24 + 1) {
            if (p_tcp->ppt_markers[local_24].m_data != (OPJ_BYTE *)0x0) {
              memcpy(p_tcp->ppt_buffer + local_28,p_tcp->ppt_markers[local_24].m_data,
                     (ulong)p_tcp->ppt_markers[local_24].m_data_size);
              local_28 = p_tcp->ppt_markers[local_24].m_data_size + local_28;
              opj_free(p_tcp->ppt_markers[local_24].m_data);
              p_tcp->ppt_markers[local_24].m_data = (OPJ_BYTE *)0x0;
              p_tcp->ppt_markers[local_24].m_data_size = 0;
            }
          }
          p_tcp->ppt_markers_count = 0;
          opj_free(p_tcp->ppt_markers);
          p_tcp->ppt_markers = (opj_ppx *)0x0;
          p_tcp->ppt_data = p_tcp->ppt_buffer;
          p_tcp->ppt_data_size = p_tcp->ppt_len;
          p_tcp_local._4_4_ = 1;
        }
      }
    }
    else {
      opj_event_msg(p_manager,1,"opj_j2k_merge_ppt() has already been called\n");
      p_tcp_local._4_4_ = 0;
    }
    return p_tcp_local._4_4_;
  }
  __assert_fail("p_manager != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                ,0x1001,"OPJ_BOOL opj_j2k_merge_ppt(opj_tcp_t *, opj_event_mgr_t *)");
}

Assistant:

static OPJ_BOOL opj_j2k_merge_ppt(opj_tcp_t *p_tcp, opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 i, l_ppt_data_size;
    /* preconditions */
    assert(p_tcp != 00);
    assert(p_manager != 00);

    if (p_tcp->ppt_buffer != NULL) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "opj_j2k_merge_ppt() has already been called\n");
        return OPJ_FALSE;
    }

    if (p_tcp->ppt == 0U) {
        return OPJ_TRUE;
    }

    l_ppt_data_size = 0U;
    for (i = 0U; i < p_tcp->ppt_markers_count; ++i) {
        l_ppt_data_size +=
            p_tcp->ppt_markers[i].m_data_size; /* can't overflow, max 256 markers of max 65536 bytes */
    }

    p_tcp->ppt_buffer = (OPJ_BYTE *) opj_malloc(l_ppt_data_size);
    if (p_tcp->ppt_buffer == 00) {
        opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to read PPT marker\n");
        return OPJ_FALSE;
    }
    p_tcp->ppt_len = l_ppt_data_size;
    l_ppt_data_size = 0U;
    for (i = 0U; i < p_tcp->ppt_markers_count; ++i) {
        if (p_tcp->ppt_markers[i].m_data !=
                NULL) { /* standard doesn't seem to require contiguous Zppt */
            memcpy(p_tcp->ppt_buffer + l_ppt_data_size, p_tcp->ppt_markers[i].m_data,
                   p_tcp->ppt_markers[i].m_data_size);
            l_ppt_data_size +=
                p_tcp->ppt_markers[i].m_data_size; /* can't overflow, max 256 markers of max 65536 bytes */

            opj_free(p_tcp->ppt_markers[i].m_data);
            p_tcp->ppt_markers[i].m_data = NULL;
            p_tcp->ppt_markers[i].m_data_size = 0U;
        }
    }

    p_tcp->ppt_markers_count = 0U;
    opj_free(p_tcp->ppt_markers);
    p_tcp->ppt_markers = NULL;

    p_tcp->ppt_data = p_tcp->ppt_buffer;
    p_tcp->ppt_data_size = p_tcp->ppt_len;
    return OPJ_TRUE;
}